

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O3

FailCodeType_conflict __thiscall
mittens::UnHandler<double>::handleException(UnHandler<double> *this)

{
  logic_error *this_00;
  undefined8 uVar1;
  exception_ptr eptr;
  long local_20;
  long local_18;
  
  std::current_exception();
  if (local_18 == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Mittens handler called outside of a catch clause! This is a BUG.");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_20 = local_18;
  std::__exception_ptr::exception_ptr::_M_addref();
  uVar1 = std::rethrow_exception((exception_ptr)&local_20);
  __cxa_free_exception();
  _Unwind_Resume(uVar1);
}

Assistant:

FailCodeType handleException()
      {
         // Instead of a call to `throw` we will check if the function was called inside a
         // catch clause. If so, `std::rethrow_exception(eptr)` is the same as `throw`.
         // Otherwise, throw an `std::logic_error` since this is obviously a bug.
         if (std::exception_ptr eptr = std::current_exception())
            std::rethrow_exception(eptr);

         throw std::logic_error("Mittens handler called outside of a catch clause! This is a BUG.");
      }